

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImage.cpp
# Opt level: O1

void __thiscall PNGImage::PNGImage(PNGImage *this,istream *input)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  __jmp_buf_tag *__env;
  runtime_error *prVar6;
  long lVar7;
  long lVar8;
  png_structp png;
  png_infop info;
  png_infop endinfo;
  png_byte sig [8];
  stringstream what;
  long local_1f8;
  long local_1f0;
  string local_1e8 [32];
  long local_1c8;
  undefined1 local_1c0 [8];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  this->_vptr_PNGImage = (_func_int **)&PTR__PNGImage_00111d50;
  (this->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->palette).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->palette).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->palette).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = 0;
  local_1f0 = 0;
  local_1c8 = 0;
  std::istream::read((char *)input,(long)local_1c0);
  iVar4 = png_sig_cmp(local_1c0,0,8);
  if (iVar4 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Bad PNG",7);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8 = png_create_read_struct("1.6.37",0,0);
  if (local_1f8 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Couldn\'t create png_struct",0x1a)
    ;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f0 = png_create_info_struct(local_1f8);
  if (local_1f0 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Couldn\'t create info_struct",0x1b);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c8 = png_create_info_struct(local_1f8);
  if (local_1c8 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Couldn\'t create (end) info_struct",0x21);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_1f8,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Internal libpng error",0x15);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  png_set_read_fn(local_1f8,input,read_data_istream);
  png_set_sig_bytes(local_1f8,8);
  png_read_png(local_1f8,local_1f0,0,0);
  iVar4 = png_get_image_width(local_1f8,local_1f0);
  this->width = iVar4;
  iVar4 = png_get_image_height(local_1f8,local_1f0);
  this->height = iVar4;
  bVar2 = png_get_bit_depth(local_1f8,local_1f0);
  this->bpp = (uint)bVar2;
  cVar3 = png_get_color_type(local_1f8,local_1f0);
  if (cVar3 == '\x02') {
    iVar4 = this->bpp * 3;
  }
  else {
    if (cVar3 != '\x06') {
      if (cVar3 == '\x03') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,
                   "Can\'t handle images with a color palette. Change the color mode of the image to RGB."
                   ,0x54);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1e8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0010cd56;
    }
    iVar4 = this->bpp << 2;
  }
  this->bpp = iVar4;
LAB_0010cd56:
  lVar7 = png_get_rowbytes(local_1f8,local_1f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->pixels,lVar7 * this->height);
  lVar7 = png_get_rows(local_1f8,local_1f0);
  uVar5 = png_get_rowbytes(local_1f8,local_1f0);
  if (0 < this->height) {
    lVar8 = 0;
    do {
      lVar1 = *(long *)(lVar7 + lVar8 * 8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->pixels,
                 (this->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,lVar1,lVar1 + (ulong)uVar5);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->height);
  }
  png_destroy_read_struct(&local_1f8,&local_1f0,&local_1c8);
  return;
}

Assistant:

PNGImage::PNGImage(std::istream &input) {
    int ctype;

    // Represents the png itself. Gets passed to pretty much every libpng function.
    // A pointer since it will be allocated by the library code.
    png_structp png = NULL;

    // Holds information about the png such as dimensions, etc.
    // A pointer since it will be allocated by the library code.
    png_infop info = NULL;

    // For some reason libpng wants another one referred to as "end info".
    // A pointer since it will be allocated by the library code.
    png_infop endinfo = NULL;

    // Storage for the first eight bytes of the file with which to check the png signature.
    png_byte sig[8];

    // Read the first eight bytes of the file to check its info.
    input.read(reinterpret_cast<char *>(sig), 8);

    // Check to see if it's a good png.
    // int png_sig_cmp (png_bytep sig, png_size_t start, png_size_t num_to_check);
    if (png_sig_cmp(sig, 0, 8)) {
        // Not a good png, the signature is messed up or it's not really a png.
        stringstream what;
        what<<"Bad PNG";
        throw runtime_error(what.str());
    }

    // Initialize the png struct for reading from files. This allocates memory.
    // png_structp png_create_read_struct (png_const_charp user_png_ver, png_voidp error_ptr, png_error_ptr error_fn, png_error_ptr warn_fn);
    png = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);

    if (!png) {
        // For some reason the png_struct wasn't created.
        stringstream what;
        what<<"Couldn't create png_struct";
        throw runtime_error(what.str());
    }

    // Initialize the info struct. This allocates memory.
    // png_infop png_create_info_struct (png_structp png_ptr);
    info = png_create_info_struct(png);

    if (!info) {
        // For some reason the info_struct wasn't created.
        stringstream what;
        what<<"Couldn't create info_struct";
        throw runtime_error(what.str());
    }

    // Initialize the info struct again? The manual does it in the example code
    // and doesn't really give any reasons.
    // png_infop png_create_info_struct (png_structp png_ptr);
    endinfo = png_create_info_struct(png);

    if (!endinfo) {
        // For some reason the (end) info_struct wasn't created.
        stringstream what;
        what<<"Couldn't create (end) info_struct";
        throw runtime_error(what.str());
    }

    // Handle interal png errors.
    // int setjmp(jmp_buf env ); from C standard
    // jmp_buf png_jmpbuf(png_structp png);
    if (setjmp(png_jmpbuf(png))) {
        // Using ancient crappy C stuff, this code below will run if libpng has an error.
        // Essentially it's like the catch part of a try-catch.
        stringstream what;
        what<<"Internal libpng error";
        throw runtime_error(what.str());
    }

    // Set the read function to use the istream
    png_set_read_fn(png, static_cast<png_voidp>(&input), read_data_istream);

    // Tell the library that I already read eight bytes from the file and that
    // the pointer has moved.
    // void png_set_sig_bytes (png_structp png_ptr, int num_bytes);
    png_set_sig_bytes(png, 8);

    // Actually reads all of the file.
    // void png_read_png (png_structp png_ptr, png_infop info_ptr, int transforms, png_voidp params);
    png_read_png(png, info, 0, NULL);

    // Pull information from the png.
    //png_uint_32 png_get_image_width (png_structp png_ptr, png_infop info_ptr);
    //png_uint_32 png_get_image_height (png_structp png_ptr, png_infop info_ptr);
    //png_byte png_get_bit_depth (png_structp png_ptr, png_infop info_ptr);
    //png_byte png_get_color_type (png_structp png_ptr, png_infop info_ptr);
    //types can be:
    //PNG_COLOR_TYPE_GRAY, PNG_COLOR_TYPE_PALETTE, PNG_COLOR_TYPE_RGB, PNG_COLOR_TYPE_RGB_ALPHA , or PNG_COLOR_TYPE_GRAY_ALPHA
    this->width = (int) png_get_image_width(png, info);
    this->height = (int) png_get_image_height(png, info);
    this->bpp = (int) png_get_bit_depth(png, info);
    ctype = (int) png_get_color_type(png, info);
    if (ctype == PNG_COLOR_TYPE_PALETTE) {
        // Don't handle images with a color palette.
        stringstream what;
        what<<"Can't handle images with a color palette. Change the color mode of the image to RGB.";
        throw runtime_error(what.str());
    }
    if (ctype == PNG_COLOR_TYPE_RGB)
        this->bpp *= 3;
    else if (ctype == PNG_COLOR_TYPE_RGB_ALPHA)
        this->bpp *= 4;

    // Allocate memory for the pixel data.
    this->pixels.reserve(png_get_rowbytes(png, info) * this->height);
    // Find the pointer to the pixel rows.
    // png_bytepp png_get_rows (png_structp png_ptr, png_infop info_ptr);
    uint8_t** tempi = png_get_rows(png, info);

    unsigned int row_size_bytes = png_get_rowbytes(png, info);
    // Copy the pixels into our own array.
    for (int y = 0; y < this->height; y++) {
        this->pixels.insert(pixels.end(), tempi[y], tempi[y]+row_size_bytes);
    }

    // Clean up.
    png_destroy_read_struct(&png, &info, &endinfo);

}